

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::ArrowButtonEx(char *str_id,ImGuiDir dir,ImVec2 size,ImGuiButtonFlags flags)

{
  ImGuiWindow *this;
  ImVec2 pos;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar1;
  bool bVar2;
  bool bVar3;
  ImGuiID id;
  ImU32 fill_col;
  ImGuiContext *g;
  ImGuiCol idx;
  float fVar4;
  float fVar5;
  bool hovered;
  bool held;
  ImRect bb;
  bool local_52;
  bool local_51;
  ImVec2 local_50;
  ImU32 local_48;
  ImGuiDir local_44;
  ImRect local_40;
  
  pIVar1 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems == false) {
    local_50 = size;
    id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    local_40.Min.x = (this->DC).CursorPos.x;
    local_40.Min.y = (this->DC).CursorPos.y;
    local_40.Max.x = local_50.x + local_40.Min.x;
    local_40.Max.y = local_50.y + local_40.Min.y;
    fVar4 = GetFrameHeight();
    if (fVar4 <= local_50.y) {
      fVar4 = (pIVar1->Style).FramePadding.y;
    }
    else {
      fVar4 = -1.0;
    }
    ItemSize(&local_50,fVar4);
    bVar3 = false;
    bVar2 = ItemAdd(&local_40,id,(ImRect *)0x0,0);
    if (bVar2) {
      local_44 = dir;
      bVar3 = ButtonBehavior(&local_40,id,&local_52,&local_51,
                             ((pIVar1->LastItemData).InFlags & 2U) << 9 | flags);
      if ((local_51 != true) || (idx = 0x17, local_52 == false)) {
        idx = local_52 + 0x15;
      }
      fill_col = GetColorU32(idx,1.0);
      local_48 = GetColorU32(0,1.0);
      RenderNavHighlight(&local_40,id,1);
      p_min.y = local_40.Min.y;
      p_min.x = local_40.Min.x;
      p_max.y = local_40.Max.y;
      p_max.x = local_40.Max.x;
      RenderFrame(p_min,p_max,fill_col,true,(pIVar1->Style).FrameRounding);
      fVar4 = (local_50.x - pIVar1->FontSize) * 0.5;
      fVar5 = (local_50.y - pIVar1->FontSize) * 0.5;
      pos.y = local_40.Min.y + (float)(-(uint)(0.0 < fVar5) & (uint)fVar5);
      pos.x = local_40.Min.x + (float)(-(uint)(0.0 < fVar4) & (uint)fVar4);
      RenderArrow(this->DrawList,pos,local_48,local_44,1.0);
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::ArrowButtonEx(const char* str_id, ImGuiDir dir, ImVec2 size, ImGuiButtonFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    const ImGuiID id = window->GetID(str_id);
    const ImRect bb(window->DC.CursorPos, window->DC.CursorPos + size);
    const float default_size = GetFrameHeight();
    ItemSize(size, (size.y >= default_size) ? g.Style.FramePadding.y : -1.0f);
    if (!ItemAdd(bb, id))
        return false;

    if (g.LastItemData.InFlags & ImGuiItemFlags_ButtonRepeat)
        flags |= ImGuiButtonFlags_Repeat;

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, flags);

    // Render
    const ImU32 bg_col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    const ImU32 text_col = GetColorU32(ImGuiCol_Text);
    RenderNavHighlight(bb, id);
    RenderFrame(bb.Min, bb.Max, bg_col, true, g.Style.FrameRounding);
    RenderArrow(window->DrawList, bb.Min + ImVec2(ImMax(0.0f, (size.x - g.FontSize) * 0.5f), ImMax(0.0f, (size.y - g.FontSize) * 0.5f)), text_col, dir);

    IMGUI_TEST_ENGINE_ITEM_INFO(id, str_id, g.LastItemData.StatusFlags);
    return pressed;
}